

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<kj::_::FiberBase::run()::__1>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_16_2_2aadf24c *func)

{
  anon_class_16_2_2aadf24c *func_local;
  
  _::FiberBase::run::anon_class_16_2_2aadf24c::operator()((anon_class_16_2_2aadf24c *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}